

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  char cVar1;
  byte bVar2;
  Mem *pVal;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  size_t sVar10;
  double dVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  char *zDate;
  byte *pbVar16;
  float *pfVar17;
  uint uVar18;
  ulong uVar19;
  byte *pbVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  bool bVar22;
  int m;
  int h;
  int D;
  int M_1;
  int M;
  int Y;
  undefined4 local_8c;
  undefined4 local_88;
  int local_84;
  int local_80;
  int local_7c;
  DateTime local_78;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p->s = 0.0;
  p->validJD = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->nFloor = '\0';
  *(undefined4 *)&p->field_0x2c = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc != 0) {
    pVal = *argv;
    if (1 < "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
            [pVal->flags & 0x3f] - 1) {
      iVar6 = 1;
      pcVar12 = (char *)sqlite3ValueText(pVal,'\x01');
      if (pcVar12 != (char *)0x0) {
        local_78.iJD = -1;
        local_40 = (double)CONCAT44(local_40._4_4_,0xaaaaaaaa);
        local_7c = -0x55555556;
        local_80 = -0x55555556;
        cVar1 = *pcVar12;
        uVar21 = (ulong)(cVar1 == '-');
        iVar5 = 0;
        iVar4 = getDigits(pcVar12 + uVar21,"40f-21a-21d");
        if (iVar4 == 3) {
          zDate = pcVar12 + uVar21 + 9;
          do {
            do {
              pbVar9 = (byte *)(zDate + 1);
              zDate = zDate + 1;
            } while ((ulong)*pbVar9 == 0x54);
          } while ((""[*pbVar9] & 1) != 0);
          iVar4 = parseHhMmSs(zDate,p);
          if (iVar4 != 0) {
            if (*zDate != '\0') goto LAB_001b6d5e;
            p->validHMS = '\0';
          }
          p->validJD = '\0';
          p->validYMD = '\x01';
          iVar4 = -local_40._0_4_;
          if (cVar1 != '-') {
            iVar4 = local_40._0_4_;
          }
          p->Y = iVar4;
          p->M = local_7c;
          p->D = local_80;
          computeFloor(p);
          if (p->tz != 0) {
            computeJD(p);
          }
        }
        else {
LAB_001b6d5e:
          iVar4 = parseHhMmSs(pcVar12,p);
          iVar5 = 0;
          if (iVar4 != 0) {
            lVar14 = 0;
            do {
              bVar3 = pcVar12[lVar14];
              bVar2 = "now"[lVar14];
              if (bVar3 == bVar2) {
                if ((ulong)bVar3 == 0) goto LAB_001b6daa;
              }
              else if (""[bVar3] != ""[bVar2]) goto LAB_001b6daa;
              lVar14 = lVar14 + 1;
            } while( true );
          }
        }
        goto LAB_001b6f27;
      }
      goto LAB_001b7da5;
    }
    dVar15 = sqlite3VdbeRealValue(pVal);
    p->s = dVar15;
    p->field_0x2c = p->field_0x2c | 1;
    if ((0.0 <= dVar15) && (dVar15 < 5373484.5)) {
      p->iJD = (long)(dVar15 * 86400000.0 + 0.5);
      p->validJD = '\x01';
    }
    goto LAB_001b6f35;
  }
  iVar6 = sqlite3NotPureFunc(context);
  if (iVar6 != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar6 = setDateTimeToCurrent(context,p);
      return iVar6;
    }
    goto LAB_001b7dd8;
  }
LAB_001b7d9f:
  iVar6 = 1;
  goto LAB_001b7da5;
LAB_001b6daa:
  if ((bVar3 != bVar2) || (iVar5 = sqlite3NotPureFunc(context), iVar5 == 0)) {
    sVar10 = strlen(pcVar12);
    iVar5 = sqlite3AtoF(pcVar12,(double *)&local_78,(uint)sVar10 & 0x3fffffff,'\x01');
    if (iVar5 < 1) {
      lVar14 = 0;
      do {
        bVar3 = pcVar12[lVar14];
        bVar2 = "subsec"[lVar14];
        if (bVar3 == bVar2) {
          if ((ulong)bVar3 == 0) goto LAB_001b6ec3;
        }
        else if (""[bVar3] != ""[bVar2]) goto LAB_001b6ec3;
        lVar14 = lVar14 + 1;
      } while( true );
    }
    p->s = (double)local_78.iJD;
    p->field_0x2c = p->field_0x2c | 1;
    iVar5 = 0;
    if ((0.0 <= (double)local_78.iJD) && ((double)local_78.iJD < 5373484.5)) {
      p->iJD = (long)((double)local_78.iJD * 86400000.0 + 0.5);
      p->validJD = '\x01';
    }
    goto LAB_001b6f27;
  }
LAB_001b6f1c:
  iVar5 = setDateTimeToCurrent(context,p);
  goto LAB_001b6f27;
LAB_001b6ef5:
  iVar5 = 1;
  if (bVar3 == bVar2) goto LAB_001b6f00;
  goto LAB_001b6f27;
LAB_001b765b:
  iVar6 = sqlite3NotPureFunc(context);
  uVar7 = 1;
  if (iVar6 == 0) goto switchD_001b7103_caseD_62;
  uVar7 = 0;
  if ((p->field_0x2c & 0x10) == 0) {
    uVar7 = toLocaltime(p,context);
  }
  bVar3 = p->field_0x2c & 0xe7 | 0x10;
LAB_001b7693:
  p->field_0x2c = bVar3;
  goto switchD_001b7103_caseD_62;
LAB_001b7515:
  if ((((1 < uVar21) || (bVar3 != bVar2)) || (p->validJD == '\0')) ||
     (bVar3 = p->field_0x2c, (bVar3 & 1) == 0)) goto switchD_001b7103_caseD_62;
  goto LAB_001b7b32;
LAB_001b76b9:
  computeJD(p);
  p->iJD = p->iJD - ((long)p->nFloor * 0x5265c0000000000 >> 0x20);
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->tz = 0;
  goto LAB_001b7c3b;
LAB_001b769b:
  computeJD(p);
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->tz = 0;
  p->nFloor = '\0';
  goto LAB_001b7c3b;
LAB_001b7461:
  if ((1 < uVar21) || (bVar3 != bVar2)) goto switchD_001b7103_caseD_62;
  bVar3 = p->field_0x2c;
  if (((bVar3 & 1) != 0) && (p->validJD == '\0')) {
    dVar15 = p->s;
    uVar7 = 0;
    if ((dVar15 < -210866760000.0) || (253402300799.0 < dVar15)) goto switchD_001b7103_caseD_62;
    p->validHMS = '\0';
    p->tz = 0;
    p->iJD = (long)(dVar15 * 1000.0 + 210866760000000.0 + 0.5);
    p->validJD = '\x01';
    p->validYMD = '\0';
    bVar3 = bVar3 & 0xfe;
    uVar7 = 0;
    goto LAB_001b7693;
  }
  goto LAB_001b7b32;
LAB_001b7c16:
  bVar3 = pbVar9[lVar14];
  if (bVar3 == "subsecond"[lVar14]) {
    if ((ulong)bVar3 == 0) goto LAB_001b7c37;
  }
  else if (""[bVar3] != ""[(byte)"subsecond"[lVar14]]) goto switchD_001b7103_caseD_62;
  lVar14 = lVar14 + 1;
  goto LAB_001b7c16;
LAB_001b7c37:
  p->field_0x2c = p->field_0x2c | 4;
  goto LAB_001b7c3b;
LAB_001b7a0b:
  if (bVar3 != bVar2) {
    lVar14 = 0;
    do {
      bVar3 = pbVar20[lVar14];
      bVar2 = "year"[lVar14];
      if (bVar3 == bVar2) {
        if ((ulong)bVar3 == 0) goto LAB_001b7a48;
      }
      else if (""[bVar3] != ""[bVar2]) goto LAB_001b7a48;
      lVar14 = lVar14 + 1;
    } while( true );
  }
  p->D = 1;
  goto LAB_001b7c3b;
LAB_001b7a48:
  if (bVar3 != bVar2) {
    lVar14 = 0;
    do {
      bVar3 = pbVar20[lVar14];
      bVar2 = "julianday"[lVar14 + 6];
      if (bVar3 == bVar2) {
        if ((ulong)bVar3 == 0) goto LAB_001b7c09;
      }
      else if (""[bVar3] != ""[bVar2]) goto LAB_001b7c09;
      lVar14 = lVar14 + 1;
    } while( true );
  }
  p->M = 1;
  p->D = 1;
  goto LAB_001b7c3b;
LAB_001b7c09:
  uVar7 = (uint)(bVar3 != bVar2);
  goto switchD_001b7103_caseD_62;
LAB_001b76ee:
  bVar3 = p->field_0x2c;
  if ((bVar3 & 1) == 0) {
LAB_001b76f9:
    lVar14 = 0;
    do {
      bVar3 = pbVar9[lVar14];
      if (bVar3 == "utc"[lVar14]) {
        if ((ulong)bVar3 == 0) goto LAB_001b7720;
      }
      else if (""[bVar3] != ""[(byte)"utc"[lVar14]]) goto switchD_001b7103_caseD_62;
      lVar14 = lVar14 + 1;
    } while( true );
  }
  if (((1 < uVar21) || (local_40 = p->s * 1000.0 + 210866760000000.0, local_40 < 0.0)) ||
     (464269060800000.0 <= local_40)) goto switchD_001b7103_caseD_62;
  p->validHMS = '\0';
  p->tz = 0;
  p->iJD = (long)(local_40 + 0.5);
  p->validJD = '\x01';
  p->validYMD = '\0';
LAB_001b7b32:
  p->field_0x2c = bVar3 & 0xfe;
LAB_001b7c3b:
  uVar7 = 0;
switchD_001b7103_caseD_62:
  if (uVar7 != 0) goto LAB_001b7d9f;
  uVar21 = uVar21 + 1;
  if (uVar21 == (uint)argc) goto LAB_001b7d5f;
  goto LAB_001b6f56;
LAB_001b7720:
  iVar6 = sqlite3NotPureFunc(context);
  uVar7 = 1;
  if ((iVar6 != 0) && (uVar7 = 0, (p->field_0x2c & 8) == 0)) {
    computeJD(p);
    dVar15 = (double)p->iJD;
    lVar14 = 0;
    dVar11 = dVar15;
    uVar18 = 0;
    do {
      local_78.Y = 0;
      local_78.M = 0;
      local_78.s = 0.0;
      local_78.D = 0;
      local_78.h = 0;
      local_78.m = 0;
      local_78.tz = 0;
      dVar11 = (double)((long)dVar11 - lVar14);
      local_78.validJD = '\x01';
      local_78.validYMD = '\0';
      local_78.validHMS = '\0';
      local_78.nFloor = '\0';
      local_78._44_4_ = 0;
      local_78.iJD = (sqlite3_int64)dVar11;
      uVar8 = toLocaltime(&local_78,context);
      pbVar16 = (byte *)(ulong)uVar8;
      if (uVar8 == 0) {
        computeJD(&local_78);
        lVar14 = local_78.iJD - (long)dVar15;
        pbVar16 = (byte *)((ulong)pbVar9 & 0xffffffff);
      }
      uVar7 = (uint)pbVar16;
      if (uVar8 != 0) goto switchD_001b7103_caseD_62;
    } while ((lVar14 != 0) && (bVar22 = uVar18 < 3, pbVar9 = pbVar16, uVar18 = uVar18 + 1, bVar22));
    p->iJD = 0;
    p->Y = 0;
    p->M = 0;
    p->s = 0.0;
    p->validJD = '\0';
    p->validYMD = '\0';
    p->validHMS = '\0';
    p->nFloor = '\0';
    *(undefined4 *)&p->field_0x2c = 0;
    p->D = 0;
    p->h = 0;
    p->m = 0;
    p->tz = 0;
    p->iJD = (sqlite3_int64)dVar11;
    p->validJD = '\x01';
    p->field_0x2c = p->field_0x2c & 0xe7 | 8;
    uVar7 = 0;
  }
  goto switchD_001b7103_caseD_62;
LAB_001b7070:
  iVar6 = sqlite3AtoF((char *)pbVar9,&local_40,iVar6,'\x01');
  if (0 < iVar6) {
    pbVar20 = pbVar9;
    if (pbVar9[uVar19] != 0x2d) {
LAB_001b7143:
      if (pbVar9[uVar19 & 0xffffffff] != 0x3a) {
        pbVar20 = pbVar20 + ((uVar19 & 0xffffffff) - 1);
        do {
          pbVar9 = pbVar20 + 1;
          pbVar20 = pbVar20 + 1;
        } while ((""[*pbVar9] & 1) != 0);
        sVar10 = strlen((char *)pbVar20);
        uVar18 = (uint)sVar10 & 0x3fffffff;
        uVar7 = 1;
        if (0xfffffff7 < uVar18 - 0xb) {
          if ((pbVar20[uVar18 - 1] & 0xdf) == 0x53) {
            uVar18 = uVar18 - 1;
          }
          computeJD(p);
          dVar11 = local_40;
          dVar15 = *(double *)(&DAT_0020b380 + (ulong)(local_40 < 0.0) * 8);
          p->nFloor = '\0';
          pfVar17 = &aXformType[0].rXform;
          lVar14 = 0;
          do {
            if ((((uVar18 == ((anon_struct_16_4_82cfffc4 *)(pfVar17 + -3))->nName) &&
                 (iVar6 = sqlite3_strnicmp((char *)((long)pfVar17 + -0xb),(char *)pbVar20,uVar18),
                 iVar6 == 0)) && ((double)-pfVar17[-1] < dVar11)) && (dVar11 < (double)pfVar17[-1]))
            {
              if ((int)lVar14 == 5) {
                computeYMD(p);
                computeHMS(p);
                p->Y = p->Y + (int)dVar11;
                computeFloor(p);
                p->validJD = '\0';
LAB_001b7d15:
                local_40 = dVar11 - (double)(int)dVar11;
              }
              else if ((int)lVar14 == 4) {
                computeYMD(p);
                computeHMS(p);
                iVar6 = p->M;
                iVar5 = iVar6 + (int)dVar11;
                p->M = iVar5;
                if (iVar5 == 0 || SCARRY4(iVar6,(int)dVar11) != iVar5 < 0) {
                  uVar7 = (iVar5 + -0xc) / 0xc;
                }
                else {
                  uVar7 = (iVar5 - 1U) / 0xc;
                }
                p->Y = p->Y + uVar7;
                p->M = iVar5 + uVar7 * -0xc;
                computeFloor(p);
                p->validJD = '\0';
                goto LAB_001b7d15;
              }
              computeJD(p);
              p->iJD = p->iJD + (long)((double)*pfVar17 * local_40 * 1000.0 + dVar15);
              uVar7 = 0;
              goto LAB_001b7392;
            }
            lVar14 = lVar14 + 1;
            pfVar17 = pfVar17 + 4;
          } while (lVar14 != 6);
          uVar7 = 1;
LAB_001b7392:
          p->validYMD = '\0';
          p->validHMS = '\0';
          p->tz = 0;
        }
        goto switchD_001b7103_caseD_62;
      }
      local_78.s = 0.0;
      local_78.validJD = '\0';
      local_78.validYMD = '\0';
      local_78.validHMS = '\0';
      local_78.nFloor = '\0';
      local_78._44_4_ = 0;
      local_78.D = 0;
      local_78.h = 0;
      local_78.m = 0;
      local_78.tz = 0;
      local_78.iJD = 0;
      local_78.Y = 0;
      local_78.M = 0;
      iVar6 = parseHhMmSs((char *)(pbVar9 + ((ulong)*pbVar9 - 0x3a < 0xfffffffffffffff6)),&local_78)
      ;
      uVar7 = 1;
      if (iVar6 != 0) goto switchD_001b7103_caseD_62;
      computeJD(&local_78);
      dVar11 = (double)((local_78.iJD + -43200000) % 86400000);
      dVar15 = (double)-(long)dVar11;
      if (bVar3 != 0x2d) {
        dVar15 = dVar11;
      }
      local_78.iJD = (sqlite3_int64)dVar15;
      computeJD(p);
      p->validYMD = '\0';
      p->validHMS = '\0';
      p->tz = 0;
      p->iJD = p->iJD + (long)dVar15;
      goto LAB_001b7c3b;
    }
    uVar7 = 1;
    if ((bVar3 != 0x2d) && (bVar3 != 0x2b)) goto switchD_001b7103_caseD_62;
    if (lVar14 == 1) {
      iVar6 = getDigits((char *)pbVar16,"40f-20a-20d",&local_7c,&local_80,&local_84);
      pbVar16 = pbVar9;
    }
    else {
      iVar6 = getDigits((char *)pbVar16,"50f-20a-20d",&local_7c,&local_80,&local_84);
    }
    iVar4 = local_80;
    iVar5 = local_84;
    if ((iVar6 == 3) && (local_84 < 0x1f && local_80 < 0xc)) {
      computeYMD(p);
      computeHMS(p);
      p->validJD = '\0';
      if (bVar3 == 0x2d) {
        p->Y = p->Y - local_7c;
        p->M = p->M - iVar4;
        local_84 = -iVar5;
      }
      else {
        p->Y = p->Y + local_7c;
        p->M = p->M + iVar4;
      }
      iVar6 = p->M;
      if (iVar6 < 1) {
        uVar7 = (iVar6 + -0xc) / 0xc;
      }
      else {
        uVar7 = (iVar6 - 1U) / 0xc;
      }
      p->Y = p->Y + uVar7;
      p->M = iVar6 + uVar7 * -0xc;
      computeFloor(p);
      computeJD(p);
      p->validYMD = '\0';
      p->validHMS = '\0';
      p->iJD = p->iJD + (long)local_84 * 86400000;
      if ((ulong)pbVar16[0xb] == 0) goto LAB_001b7c3b;
      if ((""[pbVar16[0xb]] & 1) != 0) {
        pbVar9 = pbVar16 + 0xc;
        iVar6 = getDigits((char *)pbVar9,"20c:20e",&local_88,&local_8c);
        uVar19 = 2;
        uVar7 = 1;
        pbVar20 = pbVar16;
        if (iVar6 != 2) goto switchD_001b7103_caseD_62;
        goto LAB_001b7143;
      }
    }
  }
LAB_001b73f4:
  uVar7 = 1;
  goto switchD_001b7103_caseD_62;
LAB_001b6ec3:
  if (bVar3 != bVar2) {
    lVar14 = 0;
    do {
      bVar3 = pcVar12[lVar14];
      bVar2 = "subsecond"[lVar14];
      if (bVar3 == bVar2) {
        if ((ulong)bVar3 == 0) goto LAB_001b6ef5;
      }
      else if (""[bVar3] != ""[bVar2]) goto LAB_001b6ef5;
      lVar14 = lVar14 + 1;
    } while( true );
  }
LAB_001b6f00:
  iVar5 = sqlite3NotPureFunc(context);
  if (iVar5 != 0) {
    p->field_0x2c = p->field_0x2c | 4;
    goto LAB_001b6f1c;
  }
  iVar5 = 1;
LAB_001b6f27:
  if (iVar5 == 0) {
LAB_001b6f35:
    if (1 < argc) {
      uVar21 = 1;
LAB_001b6f56:
      pbVar9 = (byte *)sqlite3ValueText(argv[uVar21],'\x01');
      sqlite3ValueBytes(argv[uVar21],'\x01');
      iVar6 = 1;
      if (pbVar9 != (byte *)0x0) {
        local_40 = -NAN;
        bVar3 = *pbVar9;
        bVar2 = ""[bVar3];
        uVar7 = 1;
        if (0x60 < bVar2) {
          if (bVar2 < 0x73) {
            switch(bVar2) {
            case 0x61:
              lVar14 = 0;
              do {
                bVar3 = pbVar9[lVar14];
                bVar2 = "auto"[lVar14];
                if (bVar3 == bVar2) {
                  if ((ulong)bVar3 == 0) goto LAB_001b7461;
                }
                else if (""[bVar3] != ""[bVar2]) goto LAB_001b7461;
                lVar14 = lVar14 + 1;
              } while( true );
            case 99:
              lVar14 = 0;
              do {
                bVar3 = pbVar9[lVar14];
                if (bVar3 == "ceiling"[lVar14]) {
                  if ((ulong)bVar3 == 0) goto LAB_001b769b;
                }
                else if (""[bVar3] != ""[(byte)"ceiling"[lVar14]]) break;
                lVar14 = lVar14 + 1;
              } while( true );
            case 0x66:
              lVar14 = 0;
              do {
                bVar3 = pbVar9[lVar14];
                if (bVar3 == "floor"[lVar14]) {
                  if ((ulong)bVar3 == 0) goto LAB_001b76b9;
                }
                else if (""[bVar3] != ""[(byte)"floor"[lVar14]]) break;
                lVar14 = lVar14 + 1;
              } while( true );
            case 0x6a:
              lVar14 = 0;
              do {
                bVar3 = pbVar9[lVar14];
                bVar2 = "julianday"[lVar14];
                if (bVar3 == bVar2) {
                  if ((ulong)bVar3 == 0) goto LAB_001b7515;
                }
                else if (""[bVar3] != ""[bVar2]) goto LAB_001b7515;
                lVar14 = lVar14 + 1;
              } while( true );
            case 0x6c:
              lVar14 = 0;
              do {
                bVar3 = pbVar9[lVar14];
                if (bVar3 == "localtime"[lVar14]) {
                  if ((ulong)bVar3 == 0) goto LAB_001b765b;
                }
                else if (""[bVar3] != ""[(byte)"localtime"[lVar14]]) break;
                lVar14 = lVar14 + 1;
              } while( true );
            }
            goto switchD_001b7103_caseD_62;
          }
          if (bVar2 == 0x73) {
            pbVar20 = pbVar9 + 9;
            lVar14 = 9;
            pcVar12 = "start of ";
            lVar13 = 0;
            pbVar16 = pbVar9;
            do {
              if ((ulong)*pbVar16 == 0) {
                pcVar12 = "start of " + lVar13;
                goto LAB_001b7987;
              }
              if (""[*pbVar16] != ""[(byte)*pcVar12]) goto LAB_001b7987;
              pbVar16 = pbVar16 + 1;
              lVar13 = lVar13 + 1;
              pcVar12 = (char *)((byte *)pcVar12 + 1);
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
            lVar14 = 0;
            pcVar12 = "";
            pbVar16 = pbVar20;
LAB_001b7987:
            if ((0 < (int)lVar14) && (""[*pbVar16] != ""[(byte)*pcVar12])) {
              lVar14 = 0;
              do {
                bVar3 = pbVar9[lVar14];
                if (bVar3 == "subsec"[lVar14]) {
                  if ((ulong)bVar3 == 0) goto LAB_001b7c37;
                }
                else if (""[bVar3] != ""[(byte)"subsec"[lVar14]]) {
                  lVar14 = 0;
                  goto LAB_001b7c16;
                }
                lVar14 = lVar14 + 1;
              } while( true );
            }
            if (((p->validJD != '\0') || (p->validYMD != '\0')) || (p->validHMS != '\0')) {
              computeYMD(p);
              p->validHMS = '\x01';
              p->h = 0;
              p->m = 0;
              p->s = 0.0;
              p->field_0x2c = p->field_0x2c & 0xfe;
              p->tz = 0;
              p->validJD = '\0';
              lVar14 = 0;
              do {
                bVar3 = pbVar20[lVar14];
                bVar2 = "month"[lVar14];
                if (bVar3 == bVar2) {
                  if ((ulong)bVar3 == 0) goto LAB_001b7a0b;
                }
                else if (""[bVar3] != ""[bVar2]) goto LAB_001b7a0b;
                lVar14 = lVar14 + 1;
              } while( true );
            }
            goto switchD_001b7103_caseD_62;
          }
          if (bVar2 != 0x77) {
            if (bVar2 == 0x75) {
              lVar14 = 0;
              do {
                bVar3 = pbVar9[lVar14];
                if (bVar3 == "unixepoch"[lVar14]) {
                  if ((ulong)bVar3 == 0) goto LAB_001b76ee;
                }
                else if (""[bVar3] != ""[(byte)"unixepoch"[lVar14]]) goto LAB_001b76f9;
                lVar14 = lVar14 + 1;
              } while( true );
            }
            goto switchD_001b7103_caseD_62;
          }
          pbVar16 = pbVar9 + 8;
          lVar14 = 8;
          pcVar12 = "weekday ";
          lVar13 = 0;
          do {
            if ((ulong)*pbVar9 == 0) {
              pcVar12 = "weekday " + lVar13;
              goto LAB_001b783d;
            }
            if (""[*pbVar9] != ""[(byte)*pcVar12]) goto LAB_001b783d;
            pbVar9 = pbVar9 + 1;
            lVar13 = lVar13 + 1;
            pcVar12 = (char *)((byte *)pcVar12 + 1);
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
          lVar14 = 0;
          pcVar12 = "";
          pbVar9 = pbVar16;
LAB_001b783d:
          if ((0 < (int)lVar14) && (""[*pbVar9] != ""[(byte)*pcVar12]))
          goto switchD_001b7103_caseD_62;
          sVar10 = strlen((char *)pbVar16);
          iVar6 = sqlite3AtoF((char *)pbVar16,&local_40,(uint)sVar10 & 0x3fffffff,'\x01');
          if ((0 < iVar6) && (0.0 <= local_40)) {
            uVar7 = 1;
            if (local_40 < 7.0) {
              if ((local_40 == (double)(int)local_40) &&
                 (!NAN(local_40) && !NAN((double)(int)local_40))) {
                iVar6 = (int)local_40;
                computeYMD(p);
                computeHMS(p);
                p->tz = 0;
                p->validJD = '\0';
                computeJD(p);
                uVar7 = 0;
                lVar14 = (p->iJD + 0x7b98a00) / 86400000;
                lVar13 = (lVar14 / 7) * -7 + -7 + lVar14;
                if (lVar14 % 7 <= (long)iVar6) {
                  lVar13 = lVar14 % 7;
                }
                p->iJD = (iVar6 - lVar13) * 86400000 + p->iJD;
                p->validYMD = '\0';
                p->validHMS = '\0';
                p->tz = 0;
              }
            }
            goto switchD_001b7103_caseD_62;
          }
          goto LAB_001b73f4;
        }
        if ((bVar2 < 0x3a) && ((0x3ff280000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          local_7c = -0x55555556;
          local_80 = -0x55555556;
          local_84 = -0x55555556;
          local_88 = 0xaaaaaaaa;
          local_8c = 0xaaaaaaaa;
          pbVar16 = pbVar9 + 1;
          uVar19 = 1;
          lVar14 = 5;
          do {
            bVar2 = pbVar9[uVar19];
            iVar6 = (int)uVar19;
            if (((bVar2 == 0) || (bVar2 == 0x3a)) || ((""[bVar2] & 1) != 0)) goto LAB_001b7070;
            if (bVar2 == 0x2d) {
              if (iVar6 == 6) {
LAB_001b7046:
                iVar5 = getDigits((char *)pbVar16,"50f",&local_7c);
                if (iVar5 == 1) goto LAB_001b7070;
              }
              else if (iVar6 == 5) {
                iVar5 = getDigits((char *)pbVar16,"40f",&local_7c);
                if (iVar5 == 1) goto LAB_001b7070;
                if (lVar14 == 0) goto LAB_001b7046;
              }
            }
            uVar19 = uVar19 + 1;
            lVar14 = lVar14 + -1;
          } while( true );
        }
        goto switchD_001b7103_caseD_62;
      }
      goto LAB_001b7da5;
    }
LAB_001b7d5f:
    computeJD(p);
    iVar6 = 1;
    if (((p->field_0x2c & 2) == 0) && ((ulong)p->iJD < 0x1a6401072fe00)) {
      iVar5 = 0;
      iVar6 = 0;
      if ((argc == 1) && ((iVar6 = iVar5, p->validYMD != '\0' && (0x1c < p->D)))) {
        p->validYMD = '\0';
      }
    }
  }
LAB_001b7da5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar6;
  }
LAB_001b7dd8:
  __stack_chk_fail();
}

Assistant:

static int isDate(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    if( !sqlite3NotPureFunc(context) ) return 1;
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p, i) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  if( argc==1 && p->validYMD && p->D>28 ){
    /* Make sure a YYYY-MM-DD is normalized.
    ** Example: 2023-02-31 -> 2023-03-03 */
    assert( p->validJD );
    p->validYMD = 0;
  }
  return 0;
}